

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WriteEquals
          (WrapperFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  once_flag *__once;
  long lVar2;
  _func_void_FieldDescriptor_ptr *local_30;
  FieldDescriptor *local_28;
  
  lVar2 = google::protobuf::FieldDescriptor::message_type();
  pFVar1 = *(FieldDescriptor **)(lVar2 + 0x28);
  if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
    local_30 = google::protobuf::FieldDescriptor::TypeOnceInit;
    local_28 = pFVar1;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(pFVar1 + 0x30),&local_30,&local_28);
  }
  if (*(int *)(pFVar1 + 0x38) != 2) {
    lVar2 = google::protobuf::FieldDescriptor::message_type();
    __once = *(once_flag **)(*(FieldDescriptor **)(lVar2 + 0x28) + 0x30);
    if (__once != (once_flag *)0x0) {
      local_30 = google::protobuf::FieldDescriptor::TypeOnceInit;
      local_28 = *(FieldDescriptor **)(lVar2 + 0x28);
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,&local_30,&local_28);
    }
  }
  google::protobuf::io::Printer::Print
            ((map *)printer,(char *)&(this->super_FieldGeneratorBase).variables_);
  return;
}

Assistant:

void WrapperFieldGenerator::WriteEquals(io::Printer* printer) {
  const char *text = "if ($property_name$ != other.$property_name$) return false;\n";
  if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_FLOAT) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableSingleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  else if (descriptor_->message_type()->field(0)->type() == FieldDescriptor::TYPE_DOUBLE) {
    text = "if (!pbc::ProtobufEqualityComparers.BitwiseNullableDoubleEqualityComparer.Equals($property_name$, other.$property_name$)) return false;\n";
  }
  printer->Print(variables_, text);
}